

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O1

bool __thiscall
bssl::dtls1_process_handshake_fragments
          (bssl *this,SSL *ssl,uint8_t *out_alert,DTLSRecordNumber record_number,
          Span<const_unsigned_char> record)

{
  ushort uVar1;
  byte *pbVar2;
  _Head_base<0UL,_bssl::DTLSIncomingMessage_*,_false> __p;
  DTLSRecordNumber t;
  bool bVar3;
  bool bVar4;
  uint16_t uVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 uVar11;
  int line;
  uint8_t *puVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  OPENSSL_timeval now;
  CBS cbs;
  hm_header_st msg_hdr;
  CBS body;
  ScopedCBB cbb;
  _Head_base<0UL,_bssl::DTLSIncomingMessage_*,_false> local_d8;
  _Head_base<0UL,_bssl::DTLSIncomingMessage_*,_false> local_d0;
  CBS local_c8;
  hm_header_st local_b4;
  SSL *local_a0;
  CBS local_98;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  DTLSRecordNumber local_68;
  CBB local_60;
  
  local_c8.len = (size_t)record.data_;
  bVar15 = (uchar *)local_c8.len == (uchar *)0x0;
  local_c8.data = (uint8_t *)record_number.combined_;
  local_a0 = ssl;
  local_68.combined_ = (uint64_t)out_alert;
  if (bVar15) {
    uVar10 = 0;
    uVar13 = 0;
  }
  else {
    local_70 = (ulong)out_alert >> 0x30;
    local_88 = 0;
    local_78 = 0;
    do {
      bVar3 = dtls1_parse_fragment(&local_c8,&local_b4,&local_98);
      if (bVar3) {
        uVar14 = (ulong)local_b4.msg_len;
        uVar13 = (ulong)local_b4.frag_off;
        uVar10 = (ulong)local_b4.frag_len;
        if (uVar14 - uVar13 < uVar10 || local_b4.msg_len < local_b4.frag_off) {
          iVar6 = 0x6d;
          line = 0x111;
LAB_0023b44c:
          ERR_put_error(0x10,0,iVar6,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                        ,line);
          *(undefined1 *)&local_a0->method = 0x2f;
        }
        else {
          pbVar2 = *(byte **)(this + 0x38);
          bVar3 = false;
          if ((local_b4.seq < *(ushort *)(pbVar2 + 4)) || ((*pbVar2 & 0x10) != 0))
          goto LAB_0023b598;
          if ((*(short *)(pbVar2 + 8) != (short)local_70) || (*(long *)(pbVar2 + 0x90) != 0)) {
            ERR_put_error(0x10,0,0xff,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                          ,0x126);
            *(undefined1 *)&local_a0->method = 10;
            goto LAB_0023b459;
          }
          sVar8 = ssl_max_handshake_message_len((SSL *)this);
          if (sVar8 < uVar14) {
            iVar6 = 0x96;
            line = 300;
            goto LAB_0023b44c;
          }
          iVar6 = SSL_in_init((SSL *)this);
          if ((iVar6 != 0) && (bVar4 = ssl_has_final_version((SSL *)this), bVar4)) {
            uVar5 = ssl_protocol_version((SSL *)this);
            local_88 = local_88 & 0xff;
            if (0x303 < uVar5) {
              local_88 = 1;
            }
          }
          uVar1 = *(ushort *)(*(long *)(this + 0x38) + 4);
          uVar7 = (uint)local_b4.seq;
          iVar6 = uVar7 - uVar1;
          if (7 < iVar6) {
            local_78 = CONCAT71((uint7)(byte)(local_b4.seq >> 8),1);
            goto LAB_0023b598;
          }
          uVar11 = 0x50;
          if ((local_b4.seq < uVar1) || (iVar6 == 7)) {
LAB_0023b7f8:
            *(undefined1 *)&local_a0->method = uVar11;
            puVar12 = (uint8_t *)0x0;
          }
          else {
            uVar9 = (ulong)(uVar7 / 7 + (uVar7 / 7) * -8 + (uint)local_b4.seq);
            puVar12 = *(uint8_t **)(*(long *)(this + 0x38) + 0x118 + uVar9 * 8);
            if (puVar12 == (uint8_t *)0x0) {
              local_80 = uVar9;
              CBB_zero(&local_60);
              local_d0._M_head_impl = (DTLSIncomingMessage *)OPENSSL_malloc(0x30);
              if (local_d0._M_head_impl == (pointer)0x0) {
                local_d0._M_head_impl = (pointer)0x0;
              }
              else {
                ((local_d0._M_head_impl)->reassembly).bytes_.size_ = 0;
                ((local_d0._M_head_impl)->reassembly).first_unmarked_byte_ = 0;
                ((local_d0._M_head_impl)->data).size_ = 0;
                ((local_d0._M_head_impl)->reassembly).bytes_.data_ = (uchar *)0x0;
                (local_d0._M_head_impl)->type = '\0';
                (local_d0._M_head_impl)->field_0x1 = 0;
                (local_d0._M_head_impl)->seq = 0;
                *(undefined4 *)&(local_d0._M_head_impl)->field_0x4 = 0;
                ((local_d0._M_head_impl)->data).data_ = (uchar *)0x0;
              }
              if (local_d0._M_head_impl == (pointer)0x0) {
LAB_0023b784:
                local_d8._M_head_impl = (pointer)0x0;
              }
              else {
                (local_d0._M_head_impl)->type = local_b4.type;
                (local_d0._M_head_impl)->seq = local_b4.seq;
                bVar4 = Array<unsigned_char>::InitUninitialized
                                  (&(local_d0._M_head_impl)->data,(ulong)(local_b4.msg_len + 0xc));
                if (((((!bVar4) ||
                      (iVar6 = CBB_init_fixed(&local_60,((local_d0._M_head_impl)->data).data_,0xc),
                      iVar6 == 0)) || (iVar6 = CBB_add_u8(&local_60,local_b4.type), iVar6 == 0)) ||
                    (((iVar6 = CBB_add_u24(&local_60,local_b4.msg_len), iVar6 == 0 ||
                      (iVar6 = CBB_add_u16(&local_60,local_b4.seq), iVar6 == 0)) ||
                     ((iVar6 = CBB_add_u24(&local_60,0), iVar6 == 0 ||
                      ((iVar6 = CBB_add_u24(&local_60,local_b4.msg_len), iVar6 == 0 ||
                       (iVar6 = CBB_finish(&local_60,(uint8_t **)0x0,(size_t *)0x0), iVar6 == 0)))))
                     ))) || (bVar4 = DTLSMessageBitmap::Init
                                               (&(local_d0._M_head_impl)->reassembly,
                                                (ulong)local_b4.msg_len), !bVar4))
                goto LAB_0023b784;
                local_d8._M_head_impl = local_d0._M_head_impl;
                local_d0._M_head_impl = (pointer)0x0;
              }
              std::unique_ptr<bssl::DTLSIncomingMessage,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<bssl::DTLSIncomingMessage,_bssl::internal::Deleter> *)&local_d0
                        );
              CBB_cleanup(&local_60);
              __p._M_head_impl = local_d8._M_head_impl;
              local_d8._M_head_impl = (DTLSIncomingMessage *)0x0;
              std::__uniq_ptr_impl<bssl::DTLSIncomingMessage,_bssl::internal::Deleter>::reset
                        ((__uniq_ptr_impl<bssl::DTLSIncomingMessage,_bssl::internal::Deleter> *)
                         (*(long *)(this + 0x38) + local_80 * 8 + 0x118),__p._M_head_impl);
              std::unique_ptr<bssl::DTLSIncomingMessage,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<bssl::DTLSIncomingMessage,_bssl::internal::Deleter> *)&local_d8
                        );
              puVar12 = *(uint8_t **)(*(long *)(this + 0x38) + 0x118 + local_80 * 8);
              uVar11 = 0x50;
              if (puVar12 == (uint8_t *)0x0) goto LAB_0023b7f8;
            }
            else {
              if (*(ushort *)(puVar12 + 2) != local_b4.seq) {
                __assert_fail("frag->seq == msg_hdr->seq",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                              ,0xe8,
                              "DTLSIncomingMessage *bssl::dtls1_get_incoming_message(SSL *, uint8_t *, const struct hm_header_st *)"
                             );
              }
              if (*puVar12 != local_b4.type) {
LAB_0023b623:
                ERR_put_error(0x10,0,0x98,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                              ,0xed);
                uVar11 = 0x2f;
                goto LAB_0023b7f8;
              }
              if (*(ulong *)(puVar12 + 0x10) < 0xc) goto LAB_0023b950;
              if (*(ulong *)(puVar12 + 0x10) - 0xc != (ulong)local_b4.msg_len) goto LAB_0023b623;
            }
          }
          if (puVar12 != (uint8_t *)0x0) {
            if (*(ulong *)(puVar12 + 0x10) < 0xc) {
LAB_0023b950:
              abort();
            }
            uVar9 = *(ulong *)(puVar12 + 0x10) - 0xc;
            if (uVar9 != uVar14) {
              __assert_fail("frag->msg_len() == msg_len",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                            ,0x14a,
                            "bool bssl::dtls1_process_handshake_fragments(SSL *, uint8_t *, DTLSRecordNumber, Span<const uint8_t>)"
                           );
            }
            if (*(long *)(puVar12 + 0x20) != 0) {
              if (uVar14 == 0) {
                __assert_fail("msg_len > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                              ,0x150,
                              "bool bssl::dtls1_process_handshake_fragments(SSL *, uint8_t *, DTLSRecordNumber, Span<const uint8_t>)"
                             );
              }
              if (uVar9 < uVar13) goto LAB_0023b950;
              if (local_98.len != 0) {
                memcpy((void *)(*(long *)(puVar12 + 8) + uVar13 + 0xc),local_98.data,local_98.len);
              }
              DTLSMessageBitmap::MarkRange
                        ((DTLSMessageBitmap *)(puVar12 + 0x18),uVar13,uVar10 + uVar13);
              bVar3 = false;
            }
            goto LAB_0023b598;
          }
        }
LAB_0023b459:
        bVar3 = true;
      }
      else {
        ERR_put_error(0x10,0,0x6d,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                      ,0x108);
        *(undefined1 *)&local_a0->method = 0x32;
        bVar3 = true;
      }
LAB_0023b598:
      if (bVar3) {
        return bVar15;
      }
      bVar15 = (uchar *)local_c8.len == (uchar *)0x0;
      uVar10 = local_88;
      uVar13 = local_78;
    } while (!bVar15);
  }
  t.combined_ = local_68.combined_;
  if ((uVar10 & 1) != 0) {
    dtls1_stop_timer((SSL *)this);
    dtls_clear_outgoing_messages((SSL *)this);
  }
  if ((uVar13 & 1) == 0) {
    MRUQueue<bssl::DTLSRecordNumber,_32UL>::PushBack
              ((MRUQueue<bssl::DTLSRecordNumber,_32UL> *)(*(long *)(this + 0x38) + 0x2b0),t);
    bVar3 = ssl_has_final_version((SSL *)this);
    if ((((bVar3) && (uVar5 = ssl_protocol_version((SSL *)this), 0x303 < uVar5)) &&
        (bVar3 = DTLSTimer::IsSet((DTLSTimer *)(*(long *)(this + 0x38) + 0x3e0)), !bVar3)) &&
       ((**(byte **)(this + 0x38) & 0x40) == 0)) {
      now = ssl_ctx_get_current_time(*(SSL_CTX **)(this + 0x68));
      DTLSTimer::StartMicroseconds
                ((DTLSTimer *)(*(long *)(this + 0x38) + 0x3e0),now,
                 (ulong)*(uint *)(*(long *)(this + 0x38) + 0x3f0) * 0xfa);
    }
  }
  return bVar15;
}

Assistant:

bool dtls1_process_handshake_fragments(SSL *ssl, uint8_t *out_alert,
                                       DTLSRecordNumber record_number,
                                       Span<const uint8_t> record) {
  bool implicit_ack = false;
  bool skipped_fragments = false;
  CBS cbs = record;
  while (CBS_len(&cbs) > 0) {
    // Read a handshake fragment.
    struct hm_header_st msg_hdr;
    CBS body;
    if (!dtls1_parse_fragment(&cbs, &msg_hdr, &body)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_HANDSHAKE_RECORD);
      *out_alert = SSL_AD_DECODE_ERROR;
      return false;
    }

    const size_t frag_off = msg_hdr.frag_off;
    const size_t frag_len = msg_hdr.frag_len;
    const size_t msg_len = msg_hdr.msg_len;
    if (frag_off > msg_len || frag_len > msg_len - frag_off) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_HANDSHAKE_RECORD);
      *out_alert = SSL_AD_ILLEGAL_PARAMETER;
      return false;
    }

    if (msg_hdr.seq < ssl->d1->handshake_read_seq ||
        ssl->d1->handshake_read_overflow) {
      // Ignore fragments from the past. This is a retransmit of data we already
      // received.
      //
      // TODO(crbug.com/42290594): Use this to drive retransmits.
      continue;
    }

    if (record_number.epoch() != ssl->d1->read_epoch.epoch ||
        ssl->d1->next_read_epoch != nullptr) {
      // New messages can only arrive in the latest epoch. This can fail if the
      // record came from |prev_read_epoch|, or if it came from |read_epoch| but
      // |next_read_epoch| exists. (It cannot come from |next_read_epoch|
      // because |next_read_epoch| becomes |read_epoch| once it receives a
      // record.)
      OPENSSL_PUT_ERROR(SSL, SSL_R_EXCESS_HANDSHAKE_DATA);
      *out_alert = SSL_AD_UNEXPECTED_MESSAGE;
      return false;
    }

    if (msg_len > ssl_max_handshake_message_len(ssl)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_EXCESSIVE_MESSAGE_SIZE);
      *out_alert = SSL_AD_ILLEGAL_PARAMETER;
      return false;
    }

    if (SSL_in_init(ssl) && ssl_has_final_version(ssl) &&
        ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
      // During the handshake, if we receive any portion of the next flight, the
      // peer must have received our most recent flight. In DTLS 1.3, this is an
      // implicit ACK. See RFC 9147, Section 7.1.
      //
      // This only applies during the handshake. After the handshake, the next
      // message may be part of a post-handshake transaction. It also does not
      // apply immediately after the handshake. As a client, receiving a
      // KeyUpdate or NewSessionTicket does not imply the server has received
      // our Finished. The server may have sent those messages in half-RTT.
      implicit_ack = true;
    }

    if (msg_hdr.seq - ssl->d1->handshake_read_seq > SSL_MAX_HANDSHAKE_FLIGHT) {
      // Ignore fragments too far in the future.
      skipped_fragments = true;
      continue;
    }

    DTLSIncomingMessage *frag =
        dtls1_get_incoming_message(ssl, out_alert, &msg_hdr);
    if (frag == nullptr) {
      return false;
    }
    assert(frag->msg_len() == msg_len);

    if (frag->reassembly.IsComplete()) {
      // The message is already assembled.
      continue;
    }
    assert(msg_len > 0);

    // Copy the body into the fragment.
    Span<uint8_t> dest = frag->msg().subspan(frag_off, CBS_len(&body));
    OPENSSL_memcpy(dest.data(), CBS_data(&body), CBS_len(&body));
    frag->reassembly.MarkRange(frag_off, frag_off + frag_len);
  }

  if (implicit_ack) {
    dtls1_stop_timer(ssl);
    dtls_clear_outgoing_messages(ssl);
  }

  if (!skipped_fragments) {
    ssl->d1->records_to_ack.PushBack(record_number);

    if (ssl_has_final_version(ssl) &&
        ssl_protocol_version(ssl) >= TLS1_3_VERSION &&
        !ssl->d1->ack_timer.IsSet() && !ssl->d1->sending_ack) {
      // Schedule sending an ACK. The delay serves several purposes:
      // - If there are more records to come, we send only one ACK.
      // - If there are more records to come and the flight is now complete, we
      //   will send the reply (which implicitly ACKs the previous flight) and
      //   cancel the timer.
      // - If there are more records to come, the flight is now complete, but
      //   generating the response is delayed (e.g. a slow, async private key),
      //   the timer will fire and we send an ACK anyway.
      OPENSSL_timeval now = ssl_ctx_get_current_time(ssl->ctx.get());
      ssl->d1->ack_timer.StartMicroseconds(
          now, uint64_t{ssl->d1->timeout_duration_ms} * 1000 / 4);
    }
  }

  return true;
}